

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O3

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
::ClipWithFunctionValues
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
           *this,FuncGraphDomain *grDom)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar1;
  
  (*this->_vptr_BasicPLApproximator[9])(grDom->lbx);
  (*this->_vptr_BasicPLApproximator[9])(grDom->ubx,this);
  (*this->_vptr_BasicPLApproximator[10])(grDom->lby,this);
  (*this->_vptr_BasicPLApproximator[10])(grDom->uby,this);
  dVar1 = extraout_XMM0_Qa_02;
  if (extraout_XMM0_Qa_01 <= extraout_XMM0_Qa_02) {
    dVar1 = extraout_XMM0_Qa_01;
  }
  if (dVar1 <= grDom->lbx) {
    dVar1 = grDom->lbx;
  }
  grDom->lbx = dVar1;
  dVar1 = extraout_XMM0_Qa_02;
  if (extraout_XMM0_Qa_02 <= extraout_XMM0_Qa_01) {
    dVar1 = extraout_XMM0_Qa_01;
  }
  if (grDom->ubx <= dVar1) {
    dVar1 = grDom->ubx;
  }
  grDom->ubx = dVar1;
  dVar1 = extraout_XMM0_Qa_00;
  if (extraout_XMM0_Qa <= extraout_XMM0_Qa_00) {
    dVar1 = extraout_XMM0_Qa;
  }
  if (dVar1 <= grDom->lby) {
    dVar1 = grDom->lby;
  }
  grDom->lby = dVar1;
  dVar1 = extraout_XMM0_Qa_00;
  if (extraout_XMM0_Qa_00 <= extraout_XMM0_Qa) {
    dVar1 = extraout_XMM0_Qa;
  }
  if (grDom->uby <= dVar1) {
    dVar1 = grDom->uby;
  }
  grDom->uby = dVar1;
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::ClipWithFunctionValues(
    FuncGraphDomain &grDom) const {
  auto imlbx = eval(grDom.lbx);
  auto imubx = eval(grDom.ubx);
  auto prelby = inverse(grDom.lby);
  auto preuby = inverse(grDom.uby);
  grDom.lbx = std::max( grDom.lbx, std::min(prelby, preuby) );
  grDom.ubx = std::min( grDom.ubx, std::max(prelby, preuby) );
  grDom.lby = std::max( grDom.lby, std::min(imlbx, imubx) );
  grDom.uby = std::min( grDom.uby, std::max(imlbx, imubx) );
}